

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::fastAccessDx
          (value_type *__return_storage_ptr__,FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_> *this
          ,int i)

{
  double dVar1;
  int iVar2;
  Fad<double> *pFVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  
  pFVar3 = (this->left_->dx_).ptr_to_data;
  dVar1 = (this->right_).constant_;
  __return_storage_ptr__->val_ = pFVar3[i].val_ / dVar1;
  iVar2 = pFVar3[i].dx_.num_elts;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (0 < (long)iVar2) {
    (__return_storage_ptr__->dx_).num_elts = iVar2;
    pdVar4 = (double *)operator_new__((long)iVar2 << 3);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar4;
  }
  __return_storage_ptr__->defaultVal = 0.0;
  lVar5 = (long)pFVar3[i].dx_.num_elts;
  if (0 < lVar5) {
    pdVar4 = (__return_storage_ptr__->dx_).ptr_to_data;
    lVar6 = 0;
    do {
      pdVar4[lVar6] = pFVar3[i].dx_.ptr_to_data[lVar6] / dVar1;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) / right_.val() ;}